

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

Weight ON_Font::WeightFromWindowsLogfontWeight(int windows_logfont_weight)

{
  Weight WVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  WVar1 = Normal;
  if ((((0xfffffc17 < windows_logfont_weight - 0x3e9U) &&
       (WVar1 = Thin, 0x95 < windows_logfont_weight)) &&
      (WVar1 = Heavy, windows_logfont_weight < 0x352)) &&
     (WVar1 = Normal, windows_logfont_weight != 400)) {
    iVar2 = 400 - windows_logfont_weight;
    iVar5 = -iVar2;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    uVar3 = 4;
    uVar4 = 0;
    do {
      iVar2 = (uint)(byte)(&DAT_006be0e0)[uVar4] * 100;
      if (uVar4 == 8) {
        iVar2 = 900;
      }
      if (uVar4 == 0) {
        iVar2 = 100;
      }
      iVar2 = iVar2 - windows_logfont_weight;
      iVar6 = -iVar2;
      if (0 < iVar2) {
        iVar6 = iVar2;
      }
      if (iVar6 < iVar5) {
        uVar3 = (uint)(byte)(&DAT_006be0e0)[uVar4];
      }
      WVar1 = (Weight)uVar3;
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      iVar5 = iVar6;
    } while ((iVar5 != 0) && (bVar7 = uVar4 < 8, uVar4 = uVar4 + 1, bVar7));
  }
  return WVar1;
}

Assistant:

ON_Font::Weight ON_Font::WeightFromWindowsLogfontWeight(
  int windows_logfont_weight
  )
{
  if ( windows_logfont_weight <= 0 || windows_logfont_weight > 1000 )
    return ON_Font::Weight::Normal;

  if ( windows_logfont_weight < 150 )
    return ON_Font::Weight::Thin;

  if ( windows_logfont_weight >= 850 )
    return ON_Font::Weight::Heavy;

  const ON_Font::Weight weights[] = 
  {
    ON_Font::Weight::Thin, // = 1
    ON_Font::Weight::Ultralight, // = 2
    ON_Font::Weight::Light, // = 3
    ON_Font::Weight::Normal, // = 4
    ON_Font::Weight::Medium, // = 5
    ON_Font::Weight::Semibold, // = 6
    ON_Font::Weight::Bold, // = 7
    ON_Font::Weight::Ultrabold, // = 8
    ON_Font::Weight::Heavy, // = 9
  };

  const size_t weight_count = sizeof(weights) / sizeof(weights[0]);
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  int delta = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(font_weight)) - windows_logfont_weight);

  for (size_t i = 0; 0 != delta && i < weight_count; i++)
  {
    // look for a closer match
    int d = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(weights[i])) - windows_logfont_weight);
    if (d < delta)
    {
      font_weight = weights[i];
      delta = d;
    }
  }

  return font_weight;
}